

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOStream.cpp
# Opt level: O0

aiReturn __thiscall
Assimp::DefaultIOStream::Seek(DefaultIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  int iVar1;
  aiOrigin pOrigin_local;
  size_t pOffset_local;
  DefaultIOStream *this_local;
  
  if (this->mFile == (FILE *)0x0) {
    this_local._4_4_ = aiReturn_FAILURE;
  }
  else {
    iVar1 = fseek((FILE *)this->mFile,pOffset,pOrigin);
    this_local._4_4_ = aiReturn_FAILURE;
    if (iVar1 == 0) {
      this_local._4_4_ = aiReturn_SUCCESS;
    }
  }
  return this_local._4_4_;
}

Assistant:

aiReturn DefaultIOStream::Seek(size_t pOffset,
     aiOrigin pOrigin)
{
    if (!mFile) {
        return AI_FAILURE;
    }

    // Just to check whether our enum maps one to one with the CRT constants
    static_assert(aiOrigin_CUR == SEEK_CUR &&
        aiOrigin_END == SEEK_END && aiOrigin_SET == SEEK_SET, "aiOrigin_CUR == SEEK_CUR && \
        aiOrigin_END == SEEK_END && aiOrigin_SET == SEEK_SET");

    // do the seek
    return (0 == ::fseek(mFile, (long)pOffset,(int)pOrigin) ? AI_SUCCESS : AI_FAILURE);
}